

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O2

void absl::lts_20250127::crc_internal::anon_unknown_0::PolyMultiply
               (uint32_t *val,uint32_t m,uint32_t poly)

{
  uint uVar1;
  uint32_t one;
  uint uVar2;
  uint uVar3;
  
  uVar1 = 0;
  for (uVar2 = 0x80000000; uVar2 != 0; uVar2 = uVar2 >> 1) {
    uVar3 = uVar2 & *val;
    if ((uVar2 & *val) != 0) {
      uVar3 = m;
    }
    uVar1 = uVar1 ^ uVar3;
    m = m >> 1 ^ -(m & 1) & poly;
  }
  *val = uVar1;
  return;
}

Assistant:

void PolyMultiply(uint32_t* val, uint32_t m, uint32_t poly) {
  uint32_t l = *val;
  uint32_t result = 0;
  auto onebit = uint32_t{0x80000000u};
  for (uint32_t one = onebit; one != 0; one >>= 1) {
    if ((l & one) != 0) {
      result ^= m;
    }
    if (m & 1) {
      m = (m >> 1) ^ poly;
    } else {
      m >>= 1;
    }
  }
  *val = result;
}